

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::tbbRadixIteration(ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
                    *this,uint shift,bool last,KeyValue *src,KeyValue *dst,size_t numTasks)

{
  size_t last_00;
  char cVar1;
  runtime_error *prVar2;
  affinity_partitioner ap;
  anon_class_40_5_1ab32771 local_100;
  size_t numTasks_local;
  anon_class_8_1_898bcfc2_conflict3 local_d0;
  uint shift_local;
  KeyValue *dst_local;
  KeyValue *src_local;
  task_group_context context;
  
  ap.super_affinity_partitioner_base.my_array = (slot_id *)0x0;
  ap.super_affinity_partitioner_base.my_size = 0;
  local_100.this = this;
  local_100.shift = &shift_local;
  local_100.src = &src_local;
  local_100.dst = &dst_local;
  local_100.numTasks = &numTasks_local;
  numTasks_local = numTasks;
  shift_local = shift;
  dst_local = dst;
  src_local = src;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_d0.func = &local_100;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for_affinity<unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_1_>(unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_1_const&,tbb::detail::d1::affinity_partitioner&)::_lambda(unsigned_long)_1_,tbb::detail::d1::affinity_partitioner>
            (0,numTasks,1,&local_d0,&ap,&context);
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar1 != '\0') {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"task cancelled");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context(&context);
  last_00 = numTasks_local;
  local_100.this = this;
  local_100.shift = &shift_local;
  local_100.src = &src_local;
  local_100.dst = &dst_local;
  local_100.numTasks = &numTasks_local;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_d0.func = &local_100;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,embree::parallel_for_affinity<unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_2_>(unsigned_long,embree::ParallelRadixSort<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue,unsigned_int>::tbbRadixIteration(unsigned_int,bool,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const*,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,unsigned_long)::_lambda(unsigned_long)_2_const&,tbb::detail::d1::affinity_partitioner&)::_lambda(unsigned_long)_1_,tbb::detail::d1::affinity_partitioner>
            (0,last_00,1,&local_d0,&ap,&context);
  cVar1 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar1 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    tbb::detail::d1::affinity_partitioner_base::~affinity_partitioner_base
              (&ap.super_affinity_partitioner_base);
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"task cancelled");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void tbbRadixIteration(const Key shift, const bool last,
                           const Ty* __restrict src, Ty* __restrict dst,
                           const size_t numTasks)
    {
      affinity_partitioner ap;
      parallel_for_affinity(numTasks,[&] (size_t taskIndex) { tbbRadixIteration0(shift,src,dst,taskIndex,numTasks); },ap);
      parallel_for_affinity(numTasks,[&] (size_t taskIndex) { tbbRadixIteration1(shift,src,dst,taskIndex,numTasks); },ap);
    }